

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptRegExp * __thiscall Js::JavascriptLibrary::CreateEmptyRegExp(JavascriptLibrary *this)

{
  Recycler *alloc;
  JavascriptRegExp *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&JavascriptRegExp::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x1518;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_40);
  this_00 = (JavascriptRegExp *)new<Memory::Recycler>(0x40,alloc,0x38bbb2);
  JavascriptRegExp::JavascriptRegExp(this_00,(this->emptyRegexPattern).ptr,(this->regexType).ptr);
  return this_00;
}

Assistant:

JavascriptRegExp* JavascriptLibrary::CreateEmptyRegExp()
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptRegExp, emptyRegexPattern,
                           this->GetRegexType());
    }